

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLinePointsindiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  GLfloat *pGVar3;
  GLuint *pGVar4;
  AdjacencyGridLineSegment *pAVar5;
  AdjacencyGridLineSegment *segmentPtr;
  uint n_1;
  uint n;
  float *travellerPtr;
  uint *travellerIndicesPtr;
  float *travellerExpectedGeometryPtr;
  float *travellerExpectedAdjacencyGeometryPtr;
  AdjacencyTestData *test_data_local;
  GeometryShaderAdjacencyTests *this_local;
  
  test_data->m_n_vertices = test_data->m_grid->m_n_segments << 1;
  test_data->m_geometry_bo_size = test_data->m_n_vertices * this->m_n_components_output * 4;
  test_data->m_vertex_data_bo_size = test_data->m_grid->m_n_points * this->m_n_components_input * 4;
  test_data->m_index_data_bo_size = test_data->m_n_vertices << 3;
  auVar1 = ZEXT416(test_data->m_geometry_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_expected_adjacency_geometry = pGVar3;
  auVar1 = ZEXT416(test_data->m_geometry_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_expected_geometry = pGVar3;
  auVar1 = ZEXT416(test_data->m_index_data_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar4 = (GLuint *)operator_new__(uVar2);
  test_data->m_index_data = pGVar4;
  auVar1 = ZEXT416(test_data->m_vertex_data_bo_size >> 2) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pGVar3 = (GLfloat *)operator_new__(uVar2);
  test_data->m_vertex_data = pGVar3;
  travellerExpectedGeometryPtr = test_data->m_expected_adjacency_geometry;
  travellerIndicesPtr = (uint *)test_data->m_expected_geometry;
  travellerPtr = (float *)test_data->m_index_data;
  _n_1 = test_data->m_vertex_data;
  for (segmentPtr._4_4_ = 0; segmentPtr._4_4_ < test_data->m_grid->m_n_points;
      segmentPtr._4_4_ = segmentPtr._4_4_ + 1) {
    *_n_1 = test_data->m_grid->m_points[segmentPtr._4_4_].x;
    _n_1[1] = test_data->m_grid->m_points[segmentPtr._4_4_].y;
    _n_1 = _n_1 + 2;
  }
  for (segmentPtr._0_4_ = 0; (uint)segmentPtr < test_data->m_grid->m_n_segments;
      segmentPtr._0_4_ = (uint)segmentPtr + 1) {
    pAVar5 = test_data->m_grid->m_line_segments + (uint)segmentPtr;
    *travellerPtr = (float)pAVar5->m_point_end_adjacent->index;
    travellerPtr[1] = (float)pAVar5->m_point_end->index;
    travellerPtr[2] = (float)pAVar5->m_point_start->index;
    travellerPtr[3] = (float)pAVar5->m_point_start_adjacent->index;
    travellerPtr = travellerPtr + 4;
    *travellerExpectedGeometryPtr = pAVar5->m_point_end_adjacent->x;
    travellerExpectedGeometryPtr[1] = pAVar5->m_point_end_adjacent->y;
    travellerExpectedGeometryPtr[2] = 0.0;
    travellerExpectedGeometryPtr[3] = 1.0;
    travellerExpectedGeometryPtr[4] = pAVar5->m_point_start_adjacent->x;
    travellerExpectedGeometryPtr[5] = pAVar5->m_point_start_adjacent->y;
    travellerExpectedGeometryPtr[6] = 0.0;
    travellerExpectedGeometryPtr[7] = 1.0;
    travellerExpectedGeometryPtr = travellerExpectedGeometryPtr + 8;
    *travellerIndicesPtr = (uint)pAVar5->m_point_end->x;
    travellerIndicesPtr[1] = (uint)pAVar5->m_point_end->y;
    travellerIndicesPtr[2] = 0;
    travellerIndicesPtr[3] = 0x3f800000;
    travellerIndicesPtr[4] = (uint)pAVar5->m_point_start->x;
    travellerIndicesPtr[5] = (uint)pAVar5->m_point_start->y;
    travellerIndicesPtr[6] = 0;
    travellerIndicesPtr[7] = 0x3f800000;
    travellerIndicesPtr = travellerIndicesPtr + 8;
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLinePointsindiced(AdjacencyTestData& test_data)
{
	float*		  travellerExpectedAdjacencyGeometryPtr = 0;
	float*		  travellerExpectedGeometryPtr			= 0;
	unsigned int* travellerIndicesPtr					= 0;
	float*		  travellerPtr							= 0;

	/* Set buffer sizes */
	test_data.m_n_vertices = test_data.m_grid->m_n_segments * 2 /* start + end points form a segment */;
	test_data.m_geometry_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_output * sizeof(float));
	test_data.m_vertex_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_grid->m_n_points * m_n_components_input * sizeof(float));
	test_data.m_index_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * 2 /* include adjacency info */ * sizeof(unsigned int));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_index_data					= new unsigned int[test_data.m_index_data_bo_size / sizeof(unsigned int)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerIndicesPtr					  = test_data.m_index_data;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected values */
	for (unsigned int n = 0; n < test_data.m_grid->m_n_points; ++n)
	{
		*travellerPtr = test_data.m_grid->m_points[n].x;
		++travellerPtr;
		*travellerPtr = test_data.m_grid->m_points[n].y;
		++travellerPtr;
	}

	for (unsigned int n = 0; n < test_data.m_grid->m_n_segments; ++n)
	{
		AdjacencyGridLineSegment* segmentPtr = test_data.m_grid->m_line_segments + n;

		*travellerIndicesPtr = segmentPtr->m_point_end_adjacent->index;
		++travellerIndicesPtr;
		*travellerIndicesPtr = segmentPtr->m_point_end->index;
		++travellerIndicesPtr;
		*travellerIndicesPtr = segmentPtr->m_point_start->index;
		++travellerIndicesPtr;
		*travellerIndicesPtr = segmentPtr->m_point_start_adjacent->index;
		++travellerIndicesPtr;

		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_end_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_end_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_start_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_start_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = segmentPtr->m_point_end->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_end->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_start->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_start->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all line segments) */
}